

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NtkGetCubeNum(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj;
  int local_20;
  int local_1c;
  int nCubes;
  int i;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  local_20 = 0;
  iVar1 = Abc_NtkHasSop(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                  ,0x77,"int Abc_NtkGetCubeNum(Abc_Ntk_t *)");
  }
  local_1c = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= local_1c) {
      return local_20;
    }
    pObj = Abc_NtkObj(pNtk,local_1c);
    if (((pObj != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj), iVar1 != 0)) &&
       (iVar1 = Abc_NodeIsConst(pObj), iVar1 == 0)) {
      if ((pObj->field_5).pData == (void *)0x0) {
        __assert_fail("pNode->pData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                      ,0x7c,"int Abc_NtkGetCubeNum(Abc_Ntk_t *)");
      }
      iVar1 = Abc_SopGetCubeNum((char *)(pObj->field_5).pData);
      local_20 = iVar1 + local_20;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

int Abc_NtkGetCubeNum( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, nCubes = 0;
    assert( Abc_NtkHasSop(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_NodeIsConst(pNode) )
            continue;
        assert( pNode->pData );
        nCubes += Abc_SopGetCubeNum( (char *)pNode->pData );
    }
    return nCubes;
}